

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O3

void If_ManSetupSet(If_Man_t *p,If_Set_t *pSet)

{
  short sVar1;
  int iVar2;
  If_Cut_t *__s;
  bool bVar3;
  long lVar4;
  
  pSet->nCuts = 0;
  sVar1 = (short)p->pPars->nCutsMax;
  pSet->nCutsMax = sVar1;
  pSet->ppCuts = (If_Cut_t **)(pSet + 1);
  if (-1 < (long)sVar1) {
    lVar4 = 0;
    do {
      iVar2 = p->nCutBytes;
      pSet->ppCuts[lVar4] =
           (If_Cut_t *)((long)&pSet[1].pNext + (long)(int)lVar4 * (long)iVar2 + (long)sVar1 * 8);
      __s = pSet->ppCuts[lVar4];
      memset(__s,0,(long)iVar2);
      __s->field_0x1e = (char)p->pPars->nLutSize;
      bVar3 = lVar4 < pSet->nCutsMax;
      lVar4 = lVar4 + 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void If_ManSetupSet( If_Man_t * p, If_Set_t * pSet )
{
    char * pArray;
    int i;
    pSet->nCuts = 0;
    pSet->nCutsMax = p->pPars->nCutsMax;
    pSet->ppCuts = (If_Cut_t **)(pSet + 1);
    pArray = (char *)pSet->ppCuts + sizeof(If_Cut_t *) * (pSet->nCutsMax+1);
    for ( i = 0; i <= pSet->nCutsMax; i++ )
    {
        pSet->ppCuts[i] = (If_Cut_t *)(pArray + i * p->nCutBytes); 
        If_CutSetup( p, pSet->ppCuts[i] );
    }
//    pArray += (pSet->nCutsMax + 1) * p->nCutBytes;
//    assert( ((char *)pArray) - ((char *)pSet) == p->nSetBytes );
}